

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

void __thiscall
cfd::core::KeyData::KeyData
          (KeyData *this,string *path_info,int32_t child_num,bool has_schnorr_pubkey)

{
  unsigned_long uVar1;
  bool bVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  reference pvVar6;
  size_type sVar7;
  undefined8 uVar8;
  size_type sVar9;
  Privkey *in_stack_fffffffffffff7f8;
  ExtPrivkey *in_stack_fffffffffffff800;
  undefined7 in_stack_fffffffffffff810;
  undefined1 in_stack_fffffffffffff817;
  undefined8 in_stack_fffffffffffff818;
  CfdError error_code;
  CfdException *in_stack_fffffffffffff820;
  Privkey *this_00;
  Pubkey local_6e0;
  Privkey local_6c8;
  Pubkey local_6a8;
  undefined1 local_690 [8];
  SchnorrPubkey schnorr_pubkey;
  Pubkey local_660;
  undefined1 local_648 [8];
  ByteData bytes;
  Privkey local_618;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_5f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_5f0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_5e8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_5e0;
  allocator local_5d1;
  string local_5d0;
  undefined1 local_5b0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> path_list;
  ExtPubkey local_580;
  ExtPubkey local_510;
  undefined1 local_49a;
  allocator local_499;
  string local_498 [32];
  CfdSourceLocation local_478;
  Pubkey local_460;
  Privkey local_448;
  ExtPubkey local_428;
  ExtPrivkey local_3b8;
  ExtPrivkey local_340;
  string local_2c8 [8];
  string base_extkey_;
  allocator local_281;
  string local_280 [32];
  CfdSourceLocation local_260;
  undefined1 local_242;
  allocator local_241;
  string local_240 [32];
  CfdSourceLocation local_220;
  ulong local_208;
  unsigned_long value;
  size_t index;
  string local_1f0 [32];
  undefined1 local_1d0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  undefined1 local_1b0 [6];
  bool exist_hardened;
  bool has_end_any_hardened;
  string key;
  string path_1;
  string local_150 [8];
  string hdkey_top;
  string local_128;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_108;
  undefined1 local_f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> child_path;
  undefined1 local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fingerprint;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> path;
  size_type pos;
  string key_info;
  bool has_schnorr_pubkey_local;
  int32_t child_num_local;
  string *path_info_local;
  KeyData *this_local;
  
  Pubkey::Pubkey(&this->pubkey_);
  Privkey::Privkey(&this->privkey_);
  ExtPrivkey::ExtPrivkey(&this->extprivkey_);
  ExtPubkey::ExtPubkey(&this->extpubkey_);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x44af3f);
  ByteData::ByteData(&this->fingerprint_);
  ::std::__cxx11::string::string((string *)&pos,(string *)path_info);
  pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)path_info);
  if ((*pcVar3 == '[') &&
     (lVar4 = ::std::__cxx11::string::find((char *)path_info,0x898182), lVar4 != -1)) {
    ::std::__cxx11::string::substr((ulong)((long)&path.field_2 + 8),(ulong)path_info);
    ::std::__cxx11::string::operator=((string *)&pos,(string *)(path.field_2._M_local_buf + 8));
    ::std::__cxx11::string::~string((string *)(path.field_2._M_local_buf + 8));
    ::std::__cxx11::string::substr((ulong)((long)&fingerprint.field_2 + 8),(ulong)path_info);
    lVar4 = ::std::__cxx11::string::find(fingerprint.field_2._M_local_buf + 8,0x85394e);
    if (lVar4 != -1) {
      if (lVar4 != 0) {
        ::std::__cxx11::string::substr((ulong)local_b8,(ulong)((long)&fingerprint.field_2 + 8));
        ByteData::ByteData((ByteData *)((long)&child_path.field_2 + 8),(string *)local_b8);
        ByteData::operator=(&in_stack_fffffffffffff800->serialize_data_,
                            &in_stack_fffffffffffff7f8->data_);
        ByteData::~ByteData((ByteData *)0x44b08a);
        ::std::__cxx11::string::~string((string *)local_b8);
      }
      ::std::__cxx11::string::substr((ulong)local_f0,(ulong)((long)&fingerprint.field_2 + 8));
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_128,"KeyData",(allocator *)(hdkey_top.field_2._M_local_buf + 0xf))
      ;
      ToArrayFromString(&local_108,(string *)local_f0,&local_128,'\0');
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&this->path_,&local_108)
      ;
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810));
      ::std::__cxx11::string::~string((string *)&local_128);
      ::std::allocator<char>::~allocator((allocator<char> *)(hdkey_top.field_2._M_local_buf + 0xf));
      ::std::__cxx11::string::~string((string *)local_f0);
    }
    ::std::__cxx11::string::~string((string *)(fingerprint.field_2._M_local_buf + 8));
  }
  ::std::__cxx11::string::string(local_150);
  uVar5 = ::std::__cxx11::string::size();
  if (4 < uVar5) {
    ::std::__cxx11::string::substr((ulong)((long)&path_1.field_2 + 8),(ulong)&pos);
    ::std::__cxx11::string::operator=(local_150,(string *)(path_1.field_2._M_local_buf + 8));
    ::std::__cxx11::string::~string((string *)(path_1.field_2._M_local_buf + 8));
  }
  bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff800,(char *)in_stack_fffffffffffff7f8);
  if ((bVar2) ||
     (bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff800,(char *)in_stack_fffffffffffff7f8), bVar2
     )) {
    ::std::__cxx11::string::string((string *)(key.field_2._M_local_buf + 8));
    ::std::__cxx11::string::string((string *)local_1b0);
    list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_1f0,"/",(allocator *)((long)&index + 7));
    StringUtil::Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1d0,(string *)&pos,(string *)local_1f0);
    ::std::__cxx11::string::~string(local_1f0);
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&index + 7));
    pvVar6 = ::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_1d0,0);
    ::std::__cxx11::string::operator=((string *)local_1b0,(string *)pvVar6);
    sVar7 = ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1d0);
    error_code = (CfdError)((ulong)in_stack_fffffffffffff818 >> 0x20);
    if (1 < sVar7) {
      value = 1;
      while( true ) {
        uVar1 = value;
        sVar7 = ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1d0);
        error_code = (CfdError)((ulong)in_stack_fffffffffffff818 >> 0x20);
        if (sVar7 <= uVar1) break;
        if (value != 1) {
          ::std::__cxx11::string::operator+=((string *)(key.field_2._M_local_buf + 8),"/");
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1d0,value);
        bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff800,(char *)in_stack_fffffffffffff7f8);
        error_code = (CfdError)((ulong)in_stack_fffffffffffff818 >> 0x20);
        if (bVar2) break;
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1d0,value);
        bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff800,(char *)in_stack_fffffffffffff7f8);
        error_code = (CfdError)((ulong)in_stack_fffffffffffff818 >> 0x20);
        if (bVar2) {
LAB_0044b541:
          list.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
          list.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
          break;
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1d0,value);
        bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff800,(char *)in_stack_fffffffffffff7f8);
        error_code = (CfdError)((ulong)in_stack_fffffffffffff818 >> 0x20);
        if (bVar2) goto LAB_0044b541;
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1d0,value);
        bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff800,(char *)in_stack_fffffffffffff7f8);
        error_code = (CfdError)((ulong)in_stack_fffffffffffff818 >> 0x20);
        if (bVar2) goto LAB_0044b541;
        pvVar6 = ::std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_1d0,value);
        ::std::__cxx11::string::operator+=
                  ((string *)(key.field_2._M_local_buf + 8),(string *)pvVar6);
        pvVar6 = ::std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_1d0,value);
        lVar4 = ::std::__cxx11::string::find((char *)pvVar6,0x85551a);
        if (lVar4 == -1) {
          pvVar6 = ::std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_1d0,value);
          lVar4 = ::std::__cxx11::string::find((char *)pvVar6,0x85551d);
          if (lVar4 != -1) goto LAB_0044b5fc;
          pvVar6 = ::std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_1d0,value);
          lVar4 = ::std::__cxx11::string::find((char *)pvVar6,0x856f6a);
          if (lVar4 != -1) goto LAB_0044b5fc;
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1d0,value);
          pcVar3 = (char *)::std::__cxx11::string::c_str();
          local_208 = strtoul(pcVar3,(char **)0x0,0);
          if (0x7fffffff < local_208) {
            list.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
          }
        }
        else {
LAB_0044b5fc:
          list.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
        }
        value = value + 1;
      }
      uVar5 = value + 1;
      sVar7 = ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1d0);
      if (uVar5 < sVar7) {
        local_220.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_hdwallet.cpp"
                     ,0x2f);
        local_220.filename = local_220.filename + 1;
        local_220.line = 0x4c6;
        local_220.funcname = "KeyData";
        logger::warn<>(&local_220,"Failed to extkey path. A \'*\' can only be specified at the end."
                      );
        local_242 = 1;
        uVar8 = __cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_240,"Failed to extkey path. A \'*\' can only be specified at the end.",
                   &local_241);
        CfdException::CfdException
                  (in_stack_fffffffffffff820,error_code,
                   (string *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810));
        local_242 = 0;
        __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
      }
      pvVar6 = ::std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1d0);
      lVar4 = ::std::__cxx11::string::find((char *)pvVar6,0x85bf3c);
      if (lVar4 != -1) {
        if (child_num < 0) {
          local_260.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_hdwallet.cpp"
                       ,0x2f);
          local_260.filename = local_260.filename + 1;
          local_260.line = 0x4d1;
          local_260.funcname = "KeyData";
          logger::warn<>(&local_260,"Failed to extkey path. A \'*\' can not support.");
          uVar8 = __cxa_allocate_exception(0x30);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_280,"Failed to extkey path. A \'*\' can not support.",&local_281);
          CfdException::CfdException
                    (in_stack_fffffffffffff820,error_code,
                     (string *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810));
          __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
        }
        ::std::__cxx11::to_string((string *)((long)&base_extkey_.field_2 + 8),child_num);
        ::std::__cxx11::string::operator+=
                  ((string *)(key.field_2._M_local_buf + 8),
                   (string *)(base_extkey_.field_2._M_local_buf + 8));
        ::std::__cxx11::string::~string((string *)(base_extkey_.field_2._M_local_buf + 8));
        if ((list.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
          ::std::__cxx11::string::operator+=((string *)(key.field_2._M_local_buf + 8),"h");
        }
      }
    }
    ::std::__cxx11::string::string(local_2c8);
    bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff800,(char *)in_stack_fffffffffffff7f8);
    if (bVar2) {
      ExtPrivkey::ExtPrivkey(&local_340,(string *)local_1b0);
      ExtPrivkey::operator=(&this->extprivkey_,&local_340);
      ExtPrivkey::~ExtPrivkey(in_stack_fffffffffffff800);
      uVar5 = ::std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        ExtPrivkey::DerivePrivkey(&local_3b8,&this->extprivkey_,(string *)((long)&key.field_2 + 8));
        ExtPrivkey::operator=(&this->extprivkey_,&local_3b8);
        ExtPrivkey::~ExtPrivkey(in_stack_fffffffffffff800);
      }
      ExtPrivkey::GetExtPubkey(&local_428,&this->extprivkey_);
      ExtPubkey::operator=(&this->extpubkey_,&local_428);
      ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffff800);
      ExtPrivkey::GetPrivkey(&local_448,&this->extprivkey_);
      Privkey::operator=((Privkey *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
      Privkey::~Privkey((Privkey *)0x44bada);
      Privkey::GetPubkey(&local_460,&this->privkey_);
      Pubkey::operator=(&this->pubkey_,&local_460);
      Pubkey::~Pubkey((Pubkey *)0x44bb0e);
    }
    else {
      if ((list.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
        local_478.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_hdwallet.cpp"
                     ,0x2f);
        local_478.filename = local_478.filename + 1;
        local_478.line = 0x4e6;
        local_478.funcname = "KeyData";
        logger::warn<>(&local_478,"Failed to extPubkey. hardened is extPrivkey only.");
        local_49a = 1;
        uVar8 = __cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_498,"Failed to extPubkey. hardened is extPrivkey only.",&local_499);
        CfdException::CfdException
                  (in_stack_fffffffffffff820,error_code,
                   (string *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810));
        local_49a = 0;
        __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ExtPubkey::ExtPubkey(&local_510,(string *)local_1b0);
      ExtPubkey::operator=(&this->extpubkey_,&local_510);
      ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffff800);
      uVar5 = ::std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        ExtPubkey::DerivePubkey(&local_580,&this->extpubkey_,(string *)((long)&key.field_2 + 8));
        ExtPubkey::operator=(&this->extpubkey_,&local_580);
        ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffff800);
      }
      ExtPubkey::GetPubkey
                ((Pubkey *)
                 &path_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&this->extpubkey_);
      Pubkey::operator=(&this->pubkey_,
                        (Pubkey *)
                        &path_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
      Pubkey::~Pubkey((Pubkey *)0x44bd0c);
    }
    uVar5 = ::std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_5d0,"KeyData",&local_5d1);
      ToArrayFromString((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_5b0,
                        (string *)((long)&key.field_2 + 8),&local_5d0,'\0');
      ::std::__cxx11::string::~string((string *)&local_5d0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
      sVar7 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->path_);
      sVar9 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_5b0);
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                (&this->path_,sVar7 + sVar9);
      local_5e0._M_current =
           (uint *)::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_5b0);
      local_5e8._M_current =
           (uint *)::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_5b0);
      local_5f0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  ::std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                            (&this->path_);
      local_5f8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  ::std::
                  copy<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                            (local_5e0,local_5e8,
                             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              )local_5f0);
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810));
    }
    ::std::__cxx11::string::~string(local_2c8);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810));
    ::std::__cxx11::string::~string((string *)local_1b0);
    ::std::__cxx11::string::~string((string *)(key.field_2._M_local_buf + 8));
  }
  else {
    bVar2 = Privkey::HasWif((string *)&pos,(NetType *)0x0,(bool *)0x0);
    if (bVar2) {
      Privkey::FromWif(&local_618,(string *)&pos,kCustomChain,true);
      this_00 = &this->privkey_;
      Privkey::operator=((Privkey *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
      Privkey::~Privkey((Privkey *)0x44bf8e);
      Privkey::GetPubkey((Pubkey *)
                         &bytes.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,this_00);
      Pubkey::operator=(&this->pubkey_,
                        (Pubkey *)
                        &bytes.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
      Pubkey::~Pubkey((Pubkey *)0x44bfc2);
    }
    else {
      ByteData::ByteData((ByteData *)local_648,(string *)&pos);
      bVar2 = Pubkey::IsValid((ByteData *)local_648);
      if (bVar2) {
        ByteData::ByteData(&in_stack_fffffffffffff800->serialize_data_,
                           &in_stack_fffffffffffff7f8->data_);
        Pubkey::Pubkey(&local_660,
                       (ByteData *)
                       &schnorr_pubkey.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
        Pubkey::operator=(&this->pubkey_,&local_660);
        Pubkey::~Pubkey((Pubkey *)0x44c045);
        ByteData::~ByteData((ByteData *)0x44c051);
      }
      else if (has_schnorr_pubkey) {
        SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)local_690,(ByteData *)local_648);
        SchnorrPubkey::CreatePubkey(&local_6a8,(SchnorrPubkey *)local_690,false);
        Pubkey::operator=(&this->pubkey_,&local_6a8);
        Pubkey::~Pubkey((Pubkey *)0x44c0d5);
        SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x44c0e1);
      }
      else {
        Privkey::Privkey(&local_6c8,(ByteData *)local_648,kMainnet,true);
        Privkey::operator=(&local_6c8,in_stack_fffffffffffff7f8);
        Privkey::~Privkey((Privkey *)0x44c150);
        Privkey::GetPubkey(&local_6e0,&this->privkey_);
        Pubkey::operator=(&this->pubkey_,&local_6e0);
        Pubkey::~Pubkey((Pubkey *)0x44c184);
      }
      ByteData::~ByteData((ByteData *)0x44c192);
    }
  }
  ::std::__cxx11::string::~string(local_150);
  ::std::__cxx11::string::~string((string *)&pos);
  return;
}

Assistant:

KeyData::KeyData(
    const std::string& path_info, int32_t child_num, bool has_schnorr_pubkey) {
  auto key_info = path_info;
  if (path_info[0] == '[') {
    // key origin information check. cut to ']'
    auto pos = path_info.find("]");
    if (pos != std::string::npos) {
      key_info = path_info.substr(pos + 1);
      auto path = path_info.substr(1, pos - 1);
      pos = path.find("/");
      if (pos != std::string::npos) {
        if (pos != 0) {
          auto fingerprint = path.substr(0, pos);
          fingerprint_ = ByteData(fingerprint);
        }
        auto child_path = path.substr(pos + 1);
        path_ = ToArrayFromString(child_path, "KeyData", 0);
      }
    }
  }
  // derive key check (xpub,etc)D
  std::string hdkey_top;
  if (key_info.size() > 4) hdkey_top = key_info.substr(1, 3);
  if ((hdkey_top == "pub") || (hdkey_top == "prv")) {
    std::string path;
    std::string key;
    bool has_end_any_hardened = false;
    bool exist_hardened = false;
    std::vector<std::string> list = StringUtil::Split(key_info, "/");
    key = list[0];
    if (list.size() > 1) {
      size_t index;
      for (index = 1; index < list.size(); ++index) {
        if (index != 1) path += "/";
        if (list[index] == "*") break;
        if ((list[index] == "*'") || (list[index] == "*h") ||
            (list[index] == "*H")) {
          has_end_any_hardened = true;
          exist_hardened = true;
          break;
        }
        path += list[index];
        if ((list[index].find("'") != std::string::npos) ||
            (list[index].find("h") != std::string::npos) ||
            (list[index].find("H") != std::string::npos)) {
          exist_hardened = true;
        } else {
          auto value = strtoul(list[index].c_str(), nullptr, 0);
          if (value >= 0x80000000) exist_hardened = true;
        }
      }
      if ((index + 1) < list.size()) {
        warn(
            CFD_LOG_SOURCE,
            "Failed to extkey path. "
            "A '*' can only be specified at the end.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to extkey path. "
            "A '*' can only be specified at the end.");
      }
      if (list.back().find("*") != std::string::npos) {
        if (child_num < 0) {
          warn(
              CFD_LOG_SOURCE,
              "Failed to extkey path. "
              "A '*' can not support.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to extkey path. "
              "A '*' can not support.");
        }
        path += std::to_string(child_num);
        if (has_end_any_hardened) path += "h";
      }
    }
    std::string base_extkey_;
    if (hdkey_top == "prv") {
      extprivkey_ = ExtPrivkey(key);
      if (!path.empty()) extprivkey_ = extprivkey_.DerivePrivkey(path);
      extpubkey_ = extprivkey_.GetExtPubkey();
      privkey_ = extprivkey_.GetPrivkey();
      pubkey_ = privkey_.GetPubkey();
    } else if (exist_hardened) {
      warn(
          CFD_LOG_SOURCE, "Failed to extPubkey. hardened is extPrivkey only.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to extPubkey. hardened is extPrivkey only.");
    } else {
      extpubkey_ = ExtPubkey(key);
      if (!path.empty()) extpubkey_ = extpubkey_.DerivePubkey(path);
      pubkey_ = extpubkey_.GetPubkey();
    }
    if (!path.empty()) {
      auto path_list = ToArrayFromString(path, "KeyData", 0);
      path_.reserve(path_.size() + path_list.size());
      std::copy(path_list.begin(), path_list.end(), std::back_inserter(path_));
    }
  } else if (Privkey::HasWif(key_info)) {
    privkey_ = Privkey::FromWif(key_info);
    pubkey_ = privkey_.GetPubkey();
  } else {
    ByteData bytes(key_info);
    if (Pubkey::IsValid(bytes)) {
      pubkey_ = Pubkey(bytes);
    } else if (has_schnorr_pubkey) {
      SchnorrPubkey schnorr_pubkey(bytes);
      pubkey_ = schnorr_pubkey.CreatePubkey();
    } else {
      privkey_ = Privkey(bytes);
      pubkey_ = privkey_.GetPubkey();
    }
  }
}